

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

type_info * __thiscall pybind11::capsule::get_pointer<pybind11::detail::type_info>(capsule *this)

{
  char *pcVar1;
  type_info *ptVar2;
  error_already_set *this_00;
  
  pcVar1 = name(this);
  ptVar2 = (type_info *)PyCapsule_GetPointer((this->super_object).super_handle.m_ptr,pcVar1);
  if (ptVar2 != (type_info *)0x0) {
    return ptVar2;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

T *get_pointer() const {
        const auto *name = this->name();
        T *result = static_cast<T *>(PyCapsule_GetPointer(m_ptr, name));
        if (!result) {
            throw error_already_set();
        }
        return result;
    }